

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O2

void pzshape::TPZShapeTetra::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  int k;
  ulong row;
  int i;
  ulong row_00;
  int j;
  ulong row_01;
  long row_02;
  uint uVar5;
  ulong uVar6;
  int local_1694;
  TPZFNMatrix<100,_double> phi2;
  TPZFNMatrix<100,_double> phi1;
  TPZFNMatrix<100,_double> phi0;
  TPZFNMatrix<100,_double> dphi2;
  TPZFNMatrix<100,_double> dphi1;
  TPZFNMatrix<100,_double> dphi0;
  ulong row_03;
  
  if (3 < order) {
    uVar5 = order - 3;
    row_03 = (ulong)uVar5;
    TPZFNMatrix<100,_double>::TPZFNMatrix(&phi0,row_03,1);
    TPZFNMatrix<100,_double>::TPZFNMatrix(&phi1,row_03,1);
    TPZFNMatrix<100,_double>::TPZFNMatrix(&phi2,row_03,1);
    TPZFNMatrix<100,_double>::TPZFNMatrix(&dphi0,1,row_03);
    TPZFNMatrix<100,_double>::TPZFNMatrix(&dphi1,1,row_03);
    TPZFNMatrix<100,_double>::TPZFNMatrix(&dphi2,1,row_03);
    (*(code *)TPZShapeLinear::fOrthogonal)(*x->fStore + *x->fStore + -1.0,row_03,&phi0,&dphi0);
    (*(code *)TPZShapeLinear::fOrthogonal)(x->fStore[1] + x->fStore[1] + -1.0,uVar5,&phi1,&dphi1);
    (*(code *)TPZShapeLinear::fOrthogonal)(x->fStore[2] + x->fStore[2] + -1.0,row_03,&phi2,&dphi2);
    local_1694 = 0;
    for (row_00 = 0; row_00 != row_03; row_00 = row_00 + 1) {
      uVar6 = row_00;
      for (row_01 = 0; row_01 != row_03; row_01 = row_01 + 1) {
        for (row = 0; row_03 != row; row = row + 1) {
          if ((int)uVar6 + (int)row < (int)uVar5) {
            pdVar4 = TPZFMatrix<double>::operator()(&phi0.super_TPZFMatrix<double>,row_00,0);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi1.super_TPZFMatrix<double>,row_01,0);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi2.super_TPZFMatrix<double>,row,0);
            dVar3 = *pdVar4;
            row_02 = (long)local_1694;
            pdVar4 = TPZFMatrix<double>::operator()(phi,row_02,0);
            *pdVar4 = dVar1 * dVar2 * dVar3;
            pdVar4 = TPZFMatrix<double>::operator()(&dphi0.super_TPZFMatrix<double>,0,row_00);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi1.super_TPZFMatrix<double>,row_01,0);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi2.super_TPZFMatrix<double>,row,0);
            dVar3 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(dphi,0,row_02);
            *pdVar4 = (dVar1 + dVar1) * dVar2 * dVar3;
            pdVar4 = TPZFMatrix<double>::operator()(&phi0.super_TPZFMatrix<double>,row_00,0);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&dphi1.super_TPZFMatrix<double>,0,row_01);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi2.super_TPZFMatrix<double>,row,0);
            dVar3 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(dphi,1,row_02);
            *pdVar4 = (dVar1 + dVar1) * dVar2 * dVar3;
            pdVar4 = TPZFMatrix<double>::operator()(&phi0.super_TPZFMatrix<double>,row_00,0);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi1.super_TPZFMatrix<double>,row_01,0);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&dphi2.super_TPZFMatrix<double>,0,row);
            dVar3 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(dphi,2,row_02);
            *pdVar4 = (dVar1 + dVar1) * dVar2 * dVar3;
            local_1694 = local_1694 + 1;
          }
        }
        uVar6 = uVar6 + 1;
      }
    }
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphi2);
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphi1);
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphi0);
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&phi2);
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&phi1);
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&phi0);
  }
  return;
}

Assistant:

void TPZShapeTetra::ShapeInternal(TPZVec<REAL> &x, int order,TPZFMatrix<REAL> &phi,
									  TPZFMatrix<REAL> &dphi) {
		if(order < 4) return;
		int ord = order-3;
		
		TPZFNMatrix<100, REAL> phi0(ord,1),phi1(ord,1),phi2(ord,1),dphi0(1,ord),dphi1(1,ord),dphi2(1,ord);
        TPZShapeLinear::fOrthogonal(2.*x[0]-1.,ord,phi0,dphi0);
        TPZShapeLinear::fOrthogonal(2.*x[1]-1.,ord,phi1,dphi1);
        TPZShapeLinear::fOrthogonal(2.*x[2]-1.,ord,phi2,dphi2);
        
        
		int index = 0;
		for (int i=0;i<ord;i++) {
			for (int j=0;j<ord;j++) {
				for (int k=0;k<ord;k++) {
					if( i+j+k < ord ) {
						//int index = ord*(ord*i+j)+k;
						phi(index,0) =  phi0(i,0)* phi1(j,0)* phi2(k,0);
						dphi(0,index) =  2.*dphi0(0,i)* phi1(j,0)* phi2(k,0);
						dphi(1,index) =  2.* phi0(i,0)*dphi1(0,j)* phi2(k,0);
						dphi(2,index) =  2.* phi0(i,0)* phi1(j,0)*dphi2(0,k);
						index++;
					}
				}
			}
		}
	}